

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VoxWriter.cpp
# Opt level: O2

ssize_t __thiscall vox::nSHP::write(nSHP *this,int __fd,void *__buf,size_t __n)

{
  long lVar1;
  FILE *__n_00;
  FILE *__s;
  void *__buf_00;
  void *extraout_RDX;
  void *__buf_01;
  void *extraout_RDX_00;
  undefined4 in_register_00000034;
  int i;
  long lVar2;
  long lVar3;
  int32_t id;
  size_t childSize;
  size_t contentSize;
  
  __s = (FILE *)CONCAT44(in_register_00000034,__fd);
  id = 0x5048536e;
  fwrite(&id,4,1,__s);
  contentSize = getSize(this);
  fwrite(&contentSize,4,1,__s);
  childSize = 0;
  fwrite(&childSize,4,1,__s);
  __n_00 = __s;
  fwrite(this,4,1,__s);
  DICT::write(&this->nodeAttribs,__fd,__buf_00,(size_t)__n_00);
  fwrite(&this->numModels,4,1,__s);
  lVar3 = 0;
  __buf_01 = extraout_RDX;
  for (lVar2 = 0; lVar1 = (long)this->numModels, lVar2 < lVar1; lVar2 = lVar2 + 1) {
    MODEL::write((MODEL *)((long)&((this->models).
                                   super__Vector_base<vox::MODEL,_std::allocator<vox::MODEL>_>.
                                   _M_impl.super__Vector_impl_data._M_start)->modelId + lVar3),__fd,
                 __buf_01,(size_t)__s);
    lVar3 = lVar3 + 0x28;
    __buf_01 = extraout_RDX_00;
  }
  return lVar1;
}

Assistant:

void nSHP::write(FILE* fp) {
    // chunk header
    int32_t id = GetMVID('n', 'S', 'H', 'P');
    fwrite(&id, sizeof(int32_t), 1, fp);
    size_t contentSize = getSize();
    fwrite(&contentSize, sizeof(int32_t), 1, fp);
    size_t childSize = 0;
    fwrite(&childSize, sizeof(int32_t), 1, fp);

    // datas's
    fwrite(&nodeId, sizeof(int32_t), 1, fp);
    nodeAttribs.write(fp);
    fwrite(&numModels, sizeof(int32_t), 1, fp);
    for (int i = 0; i < numModels; i++)
        models[i].write(fp);
}